

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O1

void __thiscall tinygltf::Parameter::Parameter(Parameter *this,Parameter *param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  bool bVar5;
  
  bVar5 = param_1->has_number_value;
  this->bool_value = param_1->bool_value;
  this->has_number_value = bVar5;
  paVar1 = &(this->string_value).field_2;
  (this->string_value)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (param_1->string_value)._M_dataplus._M_p;
  paVar2 = &(param_1->string_value).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(param_1->string_value).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->string_value).field_2 + 8) = uVar4;
  }
  else {
    (this->string_value)._M_dataplus._M_p = pcVar3;
    (this->string_value).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->string_value)._M_string_length = (param_1->string_value)._M_string_length;
  (param_1->string_value)._M_dataplus._M_p = (pointer)paVar2;
  (param_1->string_value)._M_string_length = 0;
  (param_1->string_value).field_2._M_local_buf[0] = '\0';
  (this->number_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->number_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->number_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (param_1->number_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->number_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->number_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->number_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->number_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->number_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->json_double_value)._M_t._M_impl.super__Rb_tree_header,
             &(param_1->json_double_value)._M_t._M_impl.super__Rb_tree_header);
  this->number_value = param_1->number_value;
  return;
}

Assistant:

Parameter() = default;